

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleString.cpp
# Opt level: O0

bool __thiscall SimpleString::endsWith(SimpleString *this,SimpleString *other)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  char *pcVar4;
  char *s2;
  SimpleString *in_RSI;
  SimpleString *in_RDI;
  size_t other_length;
  size_t length;
  bool local_1;
  
  sVar2 = size((SimpleString *)0x1714dd);
  sVar3 = size((SimpleString *)0x1714ec);
  if (sVar3 == 0) {
    local_1 = true;
  }
  else if (sVar2 == 0) {
    local_1 = false;
  }
  else if (sVar2 < sVar3) {
    local_1 = false;
  }
  else {
    pcVar4 = getBuffer(in_RDI);
    s2 = getBuffer(in_RSI);
    iVar1 = StrCmp(pcVar4 + (sVar2 - sVar3),s2);
    local_1 = iVar1 == 0;
  }
  return local_1;
}

Assistant:

bool SimpleString::endsWith(const SimpleString& other) const
{
    size_t length = size();
    size_t other_length = other.size();

    if (other_length == 0) return true;
    if (length == 0) return false;
    if (length < other_length) return false;

    return StrCmp(getBuffer() + length - other_length, other.getBuffer()) == 0;
}